

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O2

void __thiscall
Assimp::AMFImporter::XML_CheckNode_SkipUnsupported(AMFImporter *this,string *pParentNodeName)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  Logger *this_00;
  DeadlyImportError *this_01;
  AMFImporter *this_02;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  string nn;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  
  iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
  this_02 = (AMFImporter *)&nn;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&nn,(char *)CONCAT44(extraout_var,iVar3),(allocator<char> *)&local_1a8);
  bVar2 = false;
  lVar5 = 0;
  while( true ) {
    if (lVar5 == 3) {
      if (bVar2) {
        Throw_CloseNotFound(this_02,&nn);
      }
      this_01 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::operator+(&local_1e8,"Unknown node \"",&nn);
      std::operator+(&local_1c8,&local_1e8,"\" in ");
      std::operator+(&local_228,&local_1c8,pParentNodeName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_1a8
                     ,&local_228,".");
      DeadlyImportError::DeadlyImportError(this_01,(string *)&local_1a8);
      __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    this_02 = (AMFImporter *)&nn;
    bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nn
                            ,(char *)((long)&DAT_005cebb0 + (long)(int)(&DAT_005cebb0)[lVar5]));
    if (!bVar1) break;
LAB_003c3685:
    lVar5 = lVar5 + 1;
  }
  uVar4 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  do {
    if ((char)uVar4 != '\0') {
      if (XML_CheckNode_SkipUnsupported::skipped_before[lVar5] == false) {
        XML_CheckNode_SkipUnsupported::skipped_before[lVar5] = true;
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[16]>(&local_1a8,(char (*) [16])"Skipping node \"");
        std::operator<<((ostream *)&local_1a8,(string *)&nn);
        std::operator<<((ostream *)&local_1a8,"\" in ");
        std::operator<<((ostream *)&local_1a8,(string *)pParentNodeName);
        std::operator<<((ostream *)&local_1a8,".");
        std::__cxx11::stringbuf::str();
        Logger::warn(this_00,local_228._M_dataplus._M_p);
        std::__cxx11::string::~string((string *)&local_228);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      }
      std::__cxx11::string::~string((string *)&nn);
      return;
    }
    do {
      this_02 = (AMFImporter *)this->mReader;
      iVar3 = (*(this_02->super_BaseImporter)._vptr_BaseImporter[2])();
      if ((char)iVar3 == '\0') {
        bVar2 = true;
        goto LAB_003c3685;
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&nn
                            ,(char *)CONCAT44(extraout_var_00,iVar3));
    uVar4 = (uint)bVar2;
  } while( true );
}

Assistant:

void AMFImporter::XML_CheckNode_SkipUnsupported(const std::string& pParentNodeName)
{
    static const size_t Uns_Skip_Len = 3;
    const char* Uns_Skip[Uns_Skip_Len] = { "composite", "edge", "normal" };

    static bool skipped_before[Uns_Skip_Len] = { false, false, false };

    std::string nn(mReader->getNodeName());
    bool found = false;
    bool close_found = false;
    size_t sk_idx;

	for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)
	{
		if(nn != Uns_Skip[sk_idx]) continue;

		found = true;
		if(mReader->isEmptyElement())
		{
			close_found = true;

			goto casu_cres;
		}

		while(mReader->read())
		{
			if((mReader->getNodeType() == irr::io::EXN_ELEMENT_END) && (nn == mReader->getNodeName()))
			{
				close_found = true;

				goto casu_cres;
			}
		}
	}// for(sk_idx = 0; sk_idx < Uns_Skip_Len; sk_idx++)

casu_cres:

	if(!found) throw DeadlyImportError("Unknown node \"" + nn + "\" in " + pParentNodeName + ".");
	if(!close_found) Throw_CloseNotFound(nn);

	if(!skipped_before[sk_idx])
	{
		skipped_before[sk_idx] = true;
        ASSIMP_LOG_WARN_F("Skipping node \"", nn, "\" in ", pParentNodeName, ".");
	}
}